

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::SetEmailLogging(LogSeverity min_severity,char *addresses)

{
  char *pcVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  pcVar1 = DAT_00133be0;
  if (iVar2 == 0) {
    LogDestination::email_logging_severity_ = min_severity;
    strlen(addresses);
    std::__cxx11::string::_M_replace(0x133bd8,0,pcVar1,(ulong)addresses);
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void SetEmailLogging(LogSeverity min_severity, const char* addresses) {
  LogDestination::SetEmailLogging(min_severity, addresses);
}